

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

bool __thiscall
GEO::SystemEnvironment::get_local_value(SystemEnvironment *this,string *name,string *value)

{
  char *pcVar1;
  allocator local_39;
  string local_38 [32];
  
  pcVar1 = getenv((name->_M_dataplus)._M_p);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    std::__cxx11::string::operator=((string *)value,local_38);
    std::__cxx11::string::~string(local_38);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool SystemEnvironment::get_local_value(
        const std::string& name, std::string& value
    ) const {
        // For the moment, deactivated under Windows
#ifdef GEO_OS_WINDOWS
        geo_argused(name);
        geo_argused(value);
        return false;
#else
        char* result = ::getenv(name.c_str());
        if(result != nullptr) {
            value = std::string(result);
        }
        return result != nullptr;
#endif
    }